

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O1

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _w;
  int _h;
  uint _c;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  Mat sqsum;
  Mat sum;
  Mat local_c8;
  Mat local_78;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar14 = (ulong)_c;
  sVar2 = bottom_blob->elemsize;
  Mat::create(top_blob,_w,_h,_c,sVar2,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_c,sVar2,opt->workspace_allocator);
  iVar13 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    uVar10 = _h * _w;
    uVar15 = (ulong)uVar10;
    if (0 < (int)_c) {
      pvVar8 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      uVar11 = 0;
      do {
        fVar17 = 0.0;
        if (0 < (int)uVar10) {
          uVar12 = 0;
          do {
            fVar17 = fVar17 + *(float *)((long)pvVar8 + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
        *(float *)((long)local_78.data + uVar11 * 4) = fVar17;
        uVar11 = uVar11 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
      } while (uVar11 != uVar14);
    }
    if (this->across_channels == 0) {
      if (0 < (int)_c) {
        pvVar8 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar9 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        sVar6 = top_blob->elemsize;
        uVar11 = 0;
        do {
          if (0 < (int)uVar10) {
            fVar17 = *(float *)((long)local_78.data + uVar11 * 4);
            uVar12 = 0;
            do {
              *(float *)((long)pvVar9 + uVar12 * 4) =
                   *(float *)((long)pvVar8 + uVar12 * 4) - fVar17 * (1.0 / (float)(int)uVar10);
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          uVar11 = uVar11 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar6);
          pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar5);
        } while (uVar11 != uVar14);
      }
    }
    else {
      fVar17 = 0.0;
      if (0 < (int)_c) {
        uVar11 = 0;
        do {
          fVar17 = fVar17 + *(float *)((long)local_78.data + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      if (0 < (int)_c) {
        pvVar8 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar9 = top_blob->data;
        sVar4 = bottom_blob->elemsize;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        uVar11 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar12 = 0;
            do {
              *(float *)((long)pvVar9 + uVar12 * 4) =
                   *(float *)((long)pvVar8 + uVar12 * 4) - fVar17 / (float)(int)(_c * uVar10);
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          uVar11 = uVar11 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar5 * sVar6);
          pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
        } while (uVar11 != uVar14);
      }
    }
    if (this->normalize_variance != 0) {
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      Mat::create(&local_c8,_c,sVar2,opt->workspace_allocator);
      if (local_c8.data == (void *)0x0) {
        bVar16 = true;
      }
      else {
        bVar16 = (long)local_c8.c * local_c8.cstep == 0;
      }
      iVar13 = -100;
      if (bVar16) {
        piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
                iVar13 = -100;
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              iVar13 = -100;
            }
          }
        }
        goto LAB_0020f8bb;
      }
      if (0 < (int)_c) {
        pvVar8 = top_blob->data;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        uVar11 = 0;
        do {
          fVar17 = 0.0;
          if (0 < (int)uVar10) {
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)pvVar8 + uVar12 * 4);
              fVar17 = fVar17 + fVar1 * fVar1;
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
          *(float *)((long)local_c8.data + uVar11 * 4) = fVar17;
          uVar11 = uVar11 + 1;
          pvVar8 = (void *)((long)pvVar8 + sVar2 * sVar3);
        } while (uVar11 != uVar14);
      }
      if (this->across_channels == 0) {
        if (0 < (int)_c) {
          pvVar8 = top_blob->data;
          sVar2 = top_blob->cstep;
          sVar3 = top_blob->elemsize;
          uVar11 = 0;
          do {
            if (0 < (int)uVar10) {
              fVar17 = *(float *)((long)local_c8.data + uVar11 * 4);
              fVar1 = this->eps;
              uVar12 = 0;
              do {
                *(float *)((long)pvVar8 + uVar12 * 4) =
                     *(float *)((long)pvVar8 + uVar12 * 4) *
                     (1.0 / (SQRT(fVar17 * (1.0 / (float)(int)uVar10)) + fVar1));
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            uVar11 = uVar11 + 1;
            pvVar8 = (void *)((long)pvVar8 + sVar2 * sVar3);
          } while (uVar11 != uVar14);
        }
      }
      else {
        if ((int)_c < 1) {
          fVar17 = 0.0;
        }
        else {
          fVar17 = 0.0;
          uVar11 = 0;
          do {
            fVar17 = fVar17 + *(float *)((long)local_c8.data + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
        if (0 < (int)_c) {
          fVar1 = this->eps;
          sVar2 = top_blob->cstep;
          sVar3 = top_blob->elemsize;
          pvVar8 = top_blob->data;
          uVar11 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar12 = 0;
              do {
                *(float *)((long)pvVar8 + uVar12 * 4) =
                     *(float *)((long)pvVar8 + uVar12 * 4) *
                     (1.0 / (SQRT(fVar17 / (float)(int)(_c * uVar10)) + fVar1));
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            uVar11 = uVar11 + 1;
            pvVar8 = (void *)((long)pvVar8 + sVar2 * sVar3);
          } while (uVar11 != uVar14);
        }
      }
      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    iVar13 = 0;
  }
LAB_0020f8bb:
  piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i = 0; i < size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q = 0; q < channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i = 0; i < size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q = 0; q < channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
    }

    return 0;
}